

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load_node
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          V *values,int num_keys,AlexNode<int,_int> **node,int total_keys,
          LinearModel<int> *data_node_model)

{
  int *piVar1;
  int iVar2;
  _func_int ***node_00;
  short sVar3;
  pointer pFVar4;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar5;
  AlexNode<int,_int> *pAVar6;
  AlexNode<int,_int> *pAVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  FTNode *tree_node;
  pointer pFVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  pair<int,_double> pVar25;
  self_type *local_a0;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  LinearModel<int> local_58;
  double local_48;
  
  dVar23 = (double)num_keys;
  dVar21 = (double)(this->derived_params_).max_data_node_slots * 0.7;
  if ((dVar21 < dVar23) ||
     ((20.0 <= (*node)->cost_ && ((dVar22 = ((*node)->model_).a_, dVar22 != 0.0 || (NAN(dVar22))))))
     ) {
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    used_fanout_tree_nodes.
    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar8 = (this->experimental_params_).fanout_selection_method;
    if (iVar8 == 1) {
      pVar25 = fanout_tree::find_best_fanout_top_down<int,int,alex::AlexCompare>
                         ((this->params_).expected_insert_frac,values,num_keys,*node,total_keys,
                          &used_fanout_tree_nodes,(this->derived_params_).max_fanout,
                          (this->params_).approximate_model_computation,
                          (this->params_).approximate_cost_computation);
      dVar21 = pVar25.second;
      uVar14 = pVar25.first;
    }
    else if (iVar8 == 0) {
      pVar25 = fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
                         ((this->params_).expected_insert_frac,values,num_keys,*node,total_keys,
                          &used_fanout_tree_nodes,(this->derived_params_).max_fanout,(int)dVar21,
                          (this->params_).approximate_model_computation,
                          (this->params_).approximate_cost_computation);
      dVar21 = pVar25.second;
      uVar14 = pVar25.first;
    }
    else {
      dVar21 = 0.0;
      uVar14 = 0;
    }
    if ((dVar21 < (*node)->cost_) ||
       ((double)(this->derived_params_).max_data_node_slots * 0.7 < dVar23)) {
      piVar1 = &(this->stats_).num_model_nodes;
      *piVar1 = *piVar1 + 1;
      pAVar5 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                *)operator_new(0x40);
      pAVar6 = *node;
      sVar3 = pAVar6->level_;
      (pAVar5->super_AlexNode<int,_int>).is_leaf_ = false;
      (pAVar5->super_AlexNode<int,_int>).duplication_factor_ = '\0';
      (pAVar5->super_AlexNode<int,_int>).level_ = sVar3;
      (pAVar5->super_AlexNode<int,_int>).model_.a_ = 0.0;
      (pAVar5->super_AlexNode<int,_int>).model_.b_ = 0.0;
      (pAVar5->super_AlexNode<int,_int>).cost_ = 0.0;
      (pAVar5->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00164bd8
      ;
      pAVar5->key_less_ = (AlexCompare *)&this->field_0xbd;
      *(undefined4 *)&pAVar5->allocator_ = 0;
      pAVar5->next_leaf_ = (self_type *)0x0;
      if (uVar14 == 0) {
        dVar21 = log2(dVar23 / (double)(this->derived_params_).max_data_node_slots);
        uVar14 = (int)dVar21 + 1;
        if (used_fanout_tree_nodes.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            used_fanout_tree_nodes.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          used_fanout_tree_nodes.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               used_fanout_tree_nodes.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        fanout_tree::compute_level<int,int,std::less<int>>
                  ((this->params_).expected_insert_frac,values,num_keys,*node,total_keys,
                   &used_fanout_tree_nodes,uVar14,
                   (int)((double)(this->derived_params_).max_data_node_slots * 0.7),
                   (this->params_).approximate_model_computation,
                   (this->params_).approximate_cost_computation);
        pAVar6 = *node;
      }
      iVar8 = 1 << (uVar14 & 0x1f);
      local_48 = (double)iVar8;
      dVar21 = (pAVar6->model_).b_;
      (pAVar5->super_AlexNode<int,_int>).model_.a_ = local_48 * (pAVar6->model_).a_;
      (pAVar5->super_AlexNode<int,_int>).model_.b_ = local_48 * dVar21;
      *(int *)&pAVar5->allocator_ = iVar8;
      local_a0 = (self_type *)
                 __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                           ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_58,(long)iVar8,
                            (void *)0x0);
      pFVar4 = used_fanout_tree_nodes.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pAVar5->next_leaf_ = local_a0;
      if (used_fanout_tree_nodes.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          used_fanout_tree_nodes.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pFVar12 = used_fanout_tree_nodes.
                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = 0;
        do {
          pAVar7 = (AlexNode<int,_int> *)operator_new(0x40);
          pAVar6 = *node;
          sVar3 = pAVar6->level_;
          pAVar7->is_leaf_ = false;
          pAVar7->level_ = sVar3 + 1;
          (pAVar7->model_).a_ = 0.0;
          (pAVar7->model_).b_ = 0.0;
          pAVar7->_vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00164bd8;
          pAVar7[1]._vptr_AlexNode = (_func_int **)&this->field_0xbd;
          pAVar7[1].is_leaf_ = false;
          pAVar7[1].duplication_factor_ = '\0';
          pAVar7[1].level_ = 0;
          pAVar7[1].model_.a_ = 0.0;
          pAVar7->cost_ = pFVar12->cost;
          uVar9 = uVar14 - pFVar12->level;
          iVar15 = 1 << (uVar9 & 0x1f);
          pAVar7->duplication_factor_ = (uint8_t)uVar9;
          iVar2 = iVar15 + iVar8;
          dVar21 = (pAVar6->model_).b_;
          dVar23 = (pAVar6->model_).a_;
          dVar22 = ((double)iVar8 / local_48 - dVar21) / dVar23;
          auVar24._0_8_ = 1.0 / (((double)iVar2 / local_48 - dVar21) / dVar23 - dVar22);
          auVar24._8_8_ = 0;
          (pAVar7->model_).a_ = auVar24._0_8_;
          auVar16._8_8_ = 0x8000000000000000;
          auVar16._0_8_ = 0x8000000000000000;
          auVar16 = vxorpd_avx512vl(auVar24,auVar16);
          (pAVar7->model_).b_ = dVar22 * auVar16._0_8_;
          (&(local_a0->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar8] = (_func_int **)pAVar7;
          local_58.a_ = pFVar12->a;
          local_58.b_ = pFVar12->b;
          local_a0 = pAVar5->next_leaf_;
          node_00 = &(local_a0->super_AlexNode<int,_int>)._vptr_AlexNode + iVar8;
          bulk_load_node(this,values + pFVar12->left_boundary,
                         pFVar12->right_boundary - pFVar12->left_boundary,
                         (AlexNode<int,_int> **)node_00,total_keys,&local_58);
          pAVar6 = (AlexNode<int,_int> *)*node_00;
          pAVar6->duplication_factor_ = (char)uVar14 - (char)pFVar12->level;
          if (pAVar6->is_leaf_ == true) {
            dVar21 = pFVar12->expected_avg_shifts;
            pAVar6[4].model_.b_ = pFVar12->expected_avg_search_iterations;
            pAVar6[4].cost_ = dVar21;
          }
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (1 < iVar15) {
            auVar18 = vpbroadcastq_avx512f();
            lVar10 = (long)(iVar8 + 1);
            lVar13 = (long)iVar2;
            if ((long)iVar2 < lVar10 + 1) {
              lVar13 = lVar10 + 1;
            }
            uVar11 = 0;
            auVar19 = vpbroadcastq_avx512f();
            do {
              auVar20 = vpbroadcastq_avx512f();
              auVar20 = vporq_avx512f(auVar20,auVar17);
              vpcmpuq_avx512f(auVar20,auVar19,2);
              auVar20 = vmovdqu64_avx512f(auVar18);
              *(undefined1 (*) [64])
               (&(local_a0->super_AlexNode<int,_int>)._vptr_AlexNode + lVar10 + uVar11) = auVar20;
              uVar11 = uVar11 + 8;
            } while (((lVar13 - lVar10) + 7U & 0xfffffffffffffff8) != uVar11);
          }
          pFVar12 = pFVar12 + 1;
          iVar8 = iVar2;
        } while (pFVar12 != pFVar4);
      }
      delete_node(this,*node);
    }
    else {
      piVar1 = &(this->stats_).num_data_nodes;
      *piVar1 = *piVar1 + 1;
      pAVar5 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                *)operator_new(200);
      iVar8 = (this->derived_params_).max_data_node_slots;
      sVar3 = (*node)->level_;
      (pAVar5->super_AlexNode<int,_int>).is_leaf_ = true;
      (pAVar5->super_AlexNode<int,_int>).duplication_factor_ = '\0';
      (pAVar5->super_AlexNode<int,_int>).level_ = sVar3;
      (pAVar5->super_AlexNode<int,_int>).model_.a_ = 0.0;
      (pAVar5->super_AlexNode<int,_int>).model_.b_ = 0.0;
      (pAVar5->super_AlexNode<int,_int>).cost_ = 0.0;
      (pAVar5->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00164b60;
      pAVar5->key_less_ = (AlexCompare *)&this->field_0xbc;
      pAVar5->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
      pAVar5->next_leaf_ = (self_type *)0x0;
      pAVar5->prev_leaf_ = (self_type *)0x0;
      pAVar5->key_slots_ = (int *)0x0;
      pAVar5->payload_slots_ = (int *)0x0;
      *(undefined8 *)((long)&pAVar5->key_slots_ + 4) = 0;
      *(undefined8 *)((long)&pAVar5->payload_slots_ + 4) = 0;
      *(undefined8 *)&pAVar5->num_keys_ = 0;
      *(undefined8 *)((long)&pAVar5->bitmap_ + 4) = 0;
      pAVar5->expansion_threshold_ = 1.0;
      pAVar5->contraction_threshold_ = 0.0;
      pAVar5->max_slots_ = iVar8;
      pAVar5->num_shifts_ = 0;
      pAVar5->num_exp_search_iterations_ = 0;
      *(undefined8 *)((long)&pAVar5->num_exp_search_iterations_ + 4) = 0;
      pAVar5->num_inserts_ = 0;
      pAVar5->num_resizes_ = 0;
      pAVar5->max_key_ = -0x80000000;
      pAVar5->min_key_ = 0x7fffffff;
      pAVar5->num_right_out_of_bounds_inserts_ = 0;
      pAVar5->num_left_out_of_bounds_inserts_ = 0;
      pAVar5->expected_avg_exp_search_iterations_ = 0.0;
      pAVar5->expected_avg_shifts_ = 0.0;
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
      bulk_load(pAVar5,values,num_keys,data_node_model,(this->params_).approximate_model_computation
               );
      pAVar6 = *node;
      (pAVar5->super_AlexNode<int,_int>).cost_ = pAVar6->cost_;
      delete_node(this,pAVar6);
    }
    *node = &pAVar5->super_AlexNode<int,_int>;
    if (used_fanout_tree_nodes.
        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(used_fanout_tree_nodes.
                      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)used_fanout_tree_nodes.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)used_fanout_tree_nodes.
                            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    piVar1 = &(this->stats_).num_data_nodes;
    *piVar1 = *piVar1 + 1;
    pAVar5 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)operator_new(200);
    iVar8 = (this->derived_params_).max_data_node_slots;
    sVar3 = (*node)->level_;
    (pAVar5->super_AlexNode<int,_int>).is_leaf_ = true;
    (pAVar5->super_AlexNode<int,_int>).duplication_factor_ = '\0';
    (pAVar5->super_AlexNode<int,_int>).level_ = sVar3;
    (pAVar5->super_AlexNode<int,_int>).model_.a_ = 0.0;
    (pAVar5->super_AlexNode<int,_int>).model_.b_ = 0.0;
    (pAVar5->super_AlexNode<int,_int>).cost_ = 0.0;
    (pAVar5->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00164b60;
    pAVar5->key_less_ = (AlexCompare *)&this->field_0xbc;
    pAVar5->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
    *(undefined8 *)((long)&pAVar5->key_slots_ + 4) = 0;
    *(undefined8 *)((long)&pAVar5->payload_slots_ + 4) = 0;
    *(undefined8 *)&pAVar5->num_keys_ = 0;
    *(undefined8 *)((long)&pAVar5->bitmap_ + 4) = 0;
    pAVar5->next_leaf_ = (self_type *)0x0;
    pAVar5->prev_leaf_ = (self_type *)0x0;
    pAVar5->key_slots_ = (int *)0x0;
    pAVar5->payload_slots_ = (int *)0x0;
    pAVar5->expansion_threshold_ = 1.0;
    pAVar5->contraction_threshold_ = 0.0;
    pAVar5->max_slots_ = iVar8;
    *(undefined8 *)((long)&pAVar5->num_exp_search_iterations_ + 4) = 0;
    pAVar5->num_inserts_ = 0;
    pAVar5->num_resizes_ = 0;
    pAVar5->num_shifts_ = 0;
    pAVar5->num_exp_search_iterations_ = 0;
    pAVar5->max_key_ = -0x80000000;
    pAVar5->min_key_ = 0x7fffffff;
    pAVar5->num_right_out_of_bounds_inserts_ = 0;
    pAVar5->num_left_out_of_bounds_inserts_ = 0;
    pAVar5->expected_avg_exp_search_iterations_ = 0.0;
    pAVar5->expected_avg_shifts_ = 0.0;
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
              (pAVar5,values,num_keys,data_node_model,(this->params_).approximate_model_computation)
    ;
    pAVar6 = *node;
    (pAVar5->super_AlexNode<int,_int>).cost_ = pAVar6->cost_;
    delete_node(this,pAVar6);
    *node = (AlexNode<int,_int> *)pAVar5;
  }
  return;
}

Assistant:

void bulk_load_node(const V values[], int num_keys, AlexNode<T, P>*& node,
                      int total_keys,
                      const LinearModel<T>* data_node_model = nullptr) {
    // Automatically convert to data node when it is impossible to be better
    // than current cost
    if (num_keys <= derived_params_.max_data_node_slots *
                        data_node_type::kInitDensity_ &&
        (node->cost_ < kNodeLookupsWeight || node->model_.a_ == 0)) {
      stats_.num_data_nodes++;
      auto data_node = new (data_node_allocator().allocate(1))
          data_node_type(node->level_, derived_params_.max_data_node_slots,
                         key_less_, allocator_);
      data_node->bulk_load(values, num_keys, data_node_model,
                           params_.approximate_model_computation);
      data_node->cost_ = node->cost_;
      delete_node(node);
      node = data_node;
      return;
    }

    // Use a fanout tree to determine the best way to divide the key space into
    // child nodes
    std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;
    std::pair<int, double> best_fanout_stats;
    if (experimental_params_.fanout_selection_method == 0) {
      int max_data_node_keys = static_cast<int>(
          derived_params_.max_data_node_slots * data_node_type::kInitDensity_);
      best_fanout_stats = fanout_tree::find_best_fanout_bottom_up<T, P>(
          values, num_keys, node, total_keys, used_fanout_tree_nodes,
          derived_params_.max_fanout, max_data_node_keys,
          params_.expected_insert_frac, params_.approximate_model_computation,
          params_.approximate_cost_computation, key_less_);
    } else if (experimental_params_.fanout_selection_method == 1) {
      best_fanout_stats = fanout_tree::find_best_fanout_top_down<T, P>(
          values, num_keys, node, total_keys, used_fanout_tree_nodes,
          derived_params_.max_fanout, params_.expected_insert_frac,
          params_.approximate_model_computation,
          params_.approximate_cost_computation, key_less_);
    }
    int best_fanout_tree_depth = best_fanout_stats.first;
    double best_fanout_tree_cost = best_fanout_stats.second;

    // Decide whether this node should be a model node or data node
    if (best_fanout_tree_cost < node->cost_ ||
        num_keys > derived_params_.max_data_node_slots *
                       data_node_type::kInitDensity_) {
      // Convert to model node based on the output of the fanout tree
      stats_.num_model_nodes++;
      auto model_node = new (model_node_allocator().allocate(1))
          model_node_type(node->level_, allocator_);
      if (best_fanout_tree_depth == 0) {
        // slightly hacky: we assume this means that the node is relatively
        // uniform but we need to split in
        // order to satisfy the max node size, so we compute the fanout that
        // would satisfy that condition
        // in expectation
        best_fanout_tree_depth =
            static_cast<int>(std::log2(static_cast<double>(num_keys) /
                                       derived_params_.max_data_node_slots)) +
            1;
        used_fanout_tree_nodes.clear();
        int max_data_node_keys = static_cast<int>(
            derived_params_.max_data_node_slots * data_node_type::kInitDensity_);
        fanout_tree::compute_level<T, P>(
            values, num_keys, node, total_keys, used_fanout_tree_nodes,
            best_fanout_tree_depth, max_data_node_keys,
            params_.expected_insert_frac, params_.approximate_model_computation,
            params_.approximate_cost_computation);
      }
      int fanout = 1 << best_fanout_tree_depth;
      model_node->model_.a_ = node->model_.a_ * fanout;
      model_node->model_.b_ = node->model_.b_ * fanout;
      model_node->num_children_ = fanout;
      model_node->children_ =
          new (pointer_allocator().allocate(fanout)) AlexNode<T, P>*[fanout];

      // Instantiate all the child nodes and recurse
      int cur = 0;
      for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
        auto child_node = new (model_node_allocator().allocate(1))
            model_node_type(static_cast<short>(node->level_ + 1), allocator_);
        child_node->cost_ = tree_node.cost;
        child_node->duplication_factor_ =
            static_cast<uint8_t>(best_fanout_tree_depth - tree_node.level);
        int repeats = 1 << child_node->duplication_factor_;
        double left_value = static_cast<double>(cur) / fanout;
        double right_value = static_cast<double>(cur + repeats) / fanout;
        double left_boundary = (left_value - node->model_.b_) / node->model_.a_;
        double right_boundary =
            (right_value - node->model_.b_) / node->model_.a_;
        child_node->model_.a_ = 1.0 / (right_boundary - left_boundary);
        child_node->model_.b_ = -child_node->model_.a_ * left_boundary;
        model_node->children_[cur] = child_node;
        LinearModel<T> child_data_node_model(tree_node.a, tree_node.b);
        bulk_load_node(values + tree_node.left_boundary,
                       tree_node.right_boundary - tree_node.left_boundary,
                       model_node->children_[cur], total_keys,
                       &child_data_node_model);
        model_node->children_[cur]->duplication_factor_ =
            static_cast<uint8_t>(best_fanout_tree_depth - tree_node.level);
        if (model_node->children_[cur]->is_leaf_) {
          static_cast<data_node_type*>(model_node->children_[cur])
              ->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          static_cast<data_node_type*>(model_node->children_[cur])
              ->expected_avg_shifts_ = tree_node.expected_avg_shifts;
        }
        for (int i = cur + 1; i < cur + repeats; i++) {
          model_node->children_[i] = model_node->children_[cur];
        }
        cur += repeats;
      }

      delete_node(node);
      node = model_node;
    } else {
      // Convert to data node
      stats_.num_data_nodes++;
      auto data_node = new (data_node_allocator().allocate(1))
          data_node_type(node->level_, derived_params_.max_data_node_slots,
                         key_less_, allocator_);
      data_node->bulk_load(values, num_keys, data_node_model,
                           params_.approximate_model_computation);
      data_node->cost_ = node->cost_;
      delete_node(node);
      node = data_node;
    }
  }